

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O3

void slang::hash_combine<int,int,unsigned_long>(size_t *seed,int *v,int rest,unsigned_long rest_1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*v;
  uVar4 = *seed;
  uVar4 = (uVar4 >> 2) + uVar4 * 0x40 + 0x9e3779b9 +
          (SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)rest;
  uVar4 = (uVar4 >> 2) + 0x9e3779b9 +
          uVar4 * 0x40 +
          (SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = rest_1;
  *seed = (uVar4 >> 2) + 0x9e3779b9 +
          uVar4 * 0x40 +
          (SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar4;
  return;
}

Assistant:

inline void hash_combine(size_t& seed, const T& v, Rest... rest) {
    hash<T> hasher;
    seed ^= hasher(v) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    hash_combine(seed, rest...);
}